

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O0

void __thiscall
miniros::ServiceManager::removeServiceServerLink(ServiceManager *this,ServiceServerLinkPtr *client)

{
  bool bVar1;
  _List_iterator<std::shared_ptr<miniros::ServiceServerLink>_> __position;
  _List_iterator<std::shared_ptr<miniros::ServiceServerLink>_> in_RDI;
  _List_iterator<std::shared_ptr<miniros::ServiceServerLink>_> it;
  scoped_lock<std::mutex> lock;
  scoped_lock<std::recursive_mutex> shutdown_lock;
  mutex_type *in_stack_ffffffffffffff78;
  scoped_lock<std::mutex> *in_stack_ffffffffffffff80;
  _List_node_base *this_00;
  shared_ptr<miniros::ServiceServerLink> *in_stack_ffffffffffffff88;
  _List_iterator<std::shared_ptr<miniros::ServiceServerLink>_> in_stack_ffffffffffffff98;
  _List_const_iterator<std::shared_ptr<miniros::ServiceServerLink>_> local_60;
  _Self local_58;
  _List_node_base *local_50;
  _List_node_base *local_48;
  _Self local_40 [4];
  undefined4 local_1c;
  
  if (((ulong)in_RDI._M_node[8]._M_next & 1) == 0) {
    std::scoped_lock<std::recursive_mutex>::scoped_lock
              ((scoped_lock<std::recursive_mutex> *)in_stack_ffffffffffffff80,
               (mutex_type *)in_stack_ffffffffffffff78);
    if (((ulong)in_RDI._M_node[8]._M_next & 1) == 0) {
      std::scoped_lock<std::mutex>::scoped_lock(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78)
      ;
      this_00 = in_RDI._M_node + 4;
      local_48 = (_List_node_base *)
                 std::__cxx11::
                 list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
                 ::begin((list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
                          *)in_stack_ffffffffffffff78);
      local_50 = (_List_node_base *)
                 std::__cxx11::
                 list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
                 ::end((list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
                        *)in_stack_ffffffffffffff78);
      __position = std::
                   find<std::_List_iterator<std::shared_ptr<miniros::ServiceServerLink>>,std::shared_ptr<miniros::ServiceServerLink>>
                             (in_stack_ffffffffffffff98,in_RDI,in_stack_ffffffffffffff88);
      local_40[0]._M_node = __position._M_node;
      local_58._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
           ::end((list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
                  *)in_stack_ffffffffffffff78);
      bVar1 = std::operator!=(local_40,&local_58);
      if (bVar1) {
        std::_List_const_iterator<std::shared_ptr<miniros::ServiceServerLink>_>::
        _List_const_iterator(&local_60,local_40);
        std::__cxx11::
        list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
        ::erase((list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
                 *)this_00,(const_iterator)__position._M_node);
      }
      std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4afcc0);
      local_1c = 0;
    }
    else {
      local_1c = 1;
    }
    std::scoped_lock<std::recursive_mutex>::~scoped_lock
              ((scoped_lock<std::recursive_mutex> *)0x4afcd2);
  }
  return;
}

Assistant:

void ServiceManager::removeServiceServerLink(const ServiceServerLinkPtr& client)
{
  // Guard against this getting called as a result of shutdown() dropping all connections (where shutting_down_mutex_ is already locked)
  if (shutting_down_)
  {
    return;
  }

  std::scoped_lock<std::recursive_mutex> shutdown_lock(shutting_down_mutex_);
  // Now check again, since the state may have changed between pre-lock/now
  if (shutting_down_)
  {
    return;
  }

  std::scoped_lock<std::mutex> lock(service_server_links_mutex_);

  auto it = std::find(service_server_links_.begin(), service_server_links_.end(), client);
  if (it != service_server_links_.end())
  {
    service_server_links_.erase(it);
  }
}